

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O1

void de::cmdline::detail::Parser::dispatchParse<tcu::opt::CrashHandler>
               (OptInfo *info,char *src,TypedFieldMap *dst)

{
  undefined1 *puVar1;
  void *pvVar2;
  Entry local_30;
  
  puVar1 = (undefined1 *)operator_new(1);
  *puVar1 = 0;
  if (info->parse == (GenericParseFunc)0x0) {
    pvVar2 = findNamedValueMatch(src,info->namedValues,info->namedValuesEnd,info->namedValueStride);
    *puVar1 = *(undefined1 *)((long)pvVar2 + 8);
  }
  else {
    (*info->parse)(src,puVar1);
  }
  local_30.destructor = TypedFieldValueTraits<bool>::destroy;
  local_30.value = puVar1;
  TypedFieldMap::set(dst,(type_info *)&tcu::opt::CrashHandler::typeinfo,&local_30);
  return;
}

Assistant:

void Parser::dispatchParse (const OptInfo* info, const char* src, TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		DE_ASSERT((!!info->parse) != (!!info->namedValues));
		if (info->parse)
		{
			((typename Option<OptType>::ParseFunc)(info->parse))(src, value);
		}
		else
		{
			const void* match = findNamedValueMatch(src, info->namedValues, info->namedValuesEnd, info->namedValueStride);
			*value = static_cast<const NamedValue<typename OptTraits<OptType>::ValueType>*>(match)->value;
		}
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}